

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::setData(HinOut *this,HModel *ptr_model)

{
  long in_RSI;
  int *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *(int *)(in_RSI + 0x60c) = *in_RDI;
  *(int *)(in_RSI + 0x610) = in_RDI[1];
  *(int *)(in_RSI + 0x614) = *in_RDI + in_RDI[1];
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void HinOut::setData(HModel & ptr_model) {
	ptr_model.numCol = numCol;
    ptr_model.numRow = numRow;
    ptr_model.numTot = numCol + numRow;
    ptr_model.Astart = Astart;
    ptr_model.Aindex = Aindex;
    ptr_model.Avalue = Avalue;
    ptr_model.colCost = colCost;
    ptr_model.colLower = colLower;
    ptr_model.colUpper = colUpper;
    ptr_model.rowLower = rowLower;
    ptr_model.rowUpper = rowUpper;
}